

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O1

vector<void_*,_std::allocator<void_*>_> *
eglu::chooseConfigs(vector<void_*,_std::allocator<void_*>_> *__return_storage_ptr__,Library *egl,
                   EGLDisplay display,AttribMap *attribs)

{
  vector<int,_std::allocator<int>_> attribList;
  vector<int,_std::allocator<int>_> local_38;
  
  attribMapToList(&local_38,attribs);
  chooseConfigs(__return_storage_ptr__,egl,display,
                local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start);
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (EGLint *)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<EGLConfig> chooseConfigs (const Library& egl, EGLDisplay display, const AttribMap& attribs)
{
	const vector<EGLint>	attribList	= attribMapToList(attribs);
	return chooseConfigs(egl, display, &attribList.front());
}